

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromDecimalString
          (IEEEFloat *this,StringRef str,roundingMode rounding_mode)

{
  fltSemantics *pfVar1;
  bool bVar2;
  uint uVar3;
  opStatus oVar4;
  byte *pbVar5;
  WordType *dst;
  byte *pbVar6;
  WordType carry;
  int iVar7;
  byte *pbVar8;
  ulong multiplier;
  int iVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  Significand *dst_00;
  uint exp;
  byte *pbVar13;
  byte bVar14;
  uint uVar15;
  byte *begin;
  byte *end;
  byte *local_40;
  IEEEFloat *local_38;
  
  begin = (byte *)str.Data;
  end = begin + str.Length;
  local_40 = end;
  pbVar5 = (byte *)skipLeadingZeroesAndAnyDot((iterator)begin,(iterator)end,(iterator *)&local_40);
  pbVar6 = local_40;
  pbVar13 = local_40;
  pbVar8 = pbVar5;
  if (pbVar5 != end) {
    do {
      pbVar6 = pbVar8;
      bVar10 = *pbVar6;
      pbVar8 = pbVar6;
      if (bVar10 == 0x2e) {
        if (pbVar13 != end) {
          __assert_fail("dot == end && \"String contains multiple dots\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x155,
                        "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                       );
        }
        pbVar8 = pbVar6 + 1;
        local_40 = pbVar6;
        if (pbVar8 == end) break;
        bVar10 = *pbVar8;
        pbVar13 = pbVar6;
      }
      pbVar6 = pbVar13;
      if (((int)(char)bVar10 - 0x3aU < 0xfffffff6) ||
         (pbVar8 = pbVar8 + 1, pbVar13 = pbVar6, pbVar8 == end)) break;
    } while( true );
  }
  iVar9 = 0;
  if (pbVar8 == end) {
    exp = 0;
  }
  else {
    if ((*pbVar8 | 0x20) != 0x65) {
      __assert_fail("(*p == \'e\' || *p == \'E\') && \"Invalid character in significand\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x15f,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    if (pbVar8 == begin) {
      __assert_fail("p != begin && \"Significand has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x160,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    if ((pbVar6 != end) && ((long)pbVar8 - (long)begin == 1)) {
      __assert_fail("(dot == end || p - begin != 1) && \"Significand has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x161,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    pbVar13 = pbVar8 + 1;
    if (pbVar13 == end) {
      __assert_fail("p != end && \"Exponent has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xca,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
    }
    bVar10 = *pbVar13;
    if ((bVar10 == 0x2d) || (bVar14 = bVar10, bVar10 == 0x2b)) {
      pbVar13 = pbVar8 + 2;
      if (pbVar13 == end) {
        __assert_fail("p != end && \"Exponent has no digits\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xcf,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
      }
      bVar14 = *pbVar13;
    }
    uVar15 = (int)(char)bVar14 - 0x30;
    if (9 < uVar15) {
      __assert_fail("absExponent < 10U && \"Invalid character in exponent\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xd3,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
    }
    do {
      pbVar13 = pbVar13 + 1;
      if (pbVar13 == end) goto LAB_00190212;
      if (9 < (int)(char)*pbVar13 - 0x30U) {
        __assert_fail("value < 10U && \"Invalid character in exponent\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xd9,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
      }
      bVar2 = uVar15 < 24000;
      uVar15 = ((int)(char)*pbVar13 - 0x30U) + uVar15 * 10;
    } while (bVar2);
    uVar15 = 24000;
LAB_00190212:
    exp = -uVar15;
    if (bVar10 != 0x2d) {
      exp = uVar15;
    }
    if (pbVar6 == end) {
      pbVar6 = pbVar8;
      local_40 = pbVar8;
    }
  }
  pbVar13 = pbVar5;
  if (pbVar8 != pbVar5) {
    pbVar13 = begin;
    if (pbVar8 != begin) {
      do {
        pbVar8 = pbVar8 + -1;
        pbVar13 = begin;
        if (pbVar8 == begin) break;
      } while ((*pbVar8 == 0x30) || (pbVar13 = pbVar8, *pbVar8 == 0x2e));
    }
    exp = exp + (int)(short)(((short)pbVar6 - (short)pbVar13) - (ushort)(pbVar13 < pbVar6));
    iVar9 = (int)(short)(((short)pbVar13 - (short)pbVar5) -
                        (ushort)(pbVar5 < pbVar6 && pbVar6 < pbVar13)) + exp;
  }
  if ((pbVar5 == end) || ((int)(char)*pbVar5 - 0x3aU < 0xfffffff6)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 3;
    return opOK;
  }
  if (iVar9 < 0xc78d) {
    pfVar1 = this->semantics;
    if ((iVar9 < -0xc78a) ||
       (iVar7 = iVar9 * 0x7042 + 0x7042, iVar11 = (int)pfVar1->minExponent - pfVar1->precision,
       iVar12 = iVar11 * 0x21cb,
       iVar7 == iVar12 || SBORROW4(iVar7,iVar12) != iVar7 + iVar11 * -0x21cb < 0)) {
      this->field_0x12 = this->field_0x12 & 0xf8 | 2;
      if (pfVar1->precision - 0x40 < 0xffffff80) {
        dst_00 = (Significand *)(this->significand).parts;
      }
      else {
        dst_00 = &this->significand;
      }
      APInt::tcSet(&dst_00->part,0,pfVar1->precision + 0x40 >> 6);
      oVar4 = normalize(this,rounding_mode,lfLessThanHalf);
      return oVar4;
    }
    iVar9 = iVar9 * 0xa437 + -0xa437;
    if (SBORROW4(iVar9,pfVar1->maxExponent * 0x316f) != iVar9 + pfVar1->maxExponent * -0x316f < 0) {
      local_38 = this;
      dst = (WordType *)
            operator_new__((ulong)(((((int)pbVar13 - (int)pbVar5) * 0xc4 + 0xc4U) / 0x3b + 0x40 >> 6
                                   ) * 8 + 8));
      uVar15 = 0;
LAB_0019037c:
      multiplier = 1;
      carry = 0;
      do {
        bVar10 = *begin;
        pbVar8 = begin;
        if (bVar10 == 0x2e) {
          pbVar8 = begin + 1;
          begin = end;
          if (pbVar8 == end) goto LAB_001903cb;
          bVar10 = *pbVar8;
        }
        if (9 < (int)(char)bVar10 - 0x30U) {
          __assert_fail("decValue < 10U && \"Invalid character in significand\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x9dc,
                        "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromDecimalString(StringRef, roundingMode)"
                       );
        }
        begin = pbVar8 + 1;
        multiplier = multiplier * 10;
        carry = (ulong)((int)(char)bVar10 - 0x30U) + carry * 10;
        if ((pbVar13 < begin) || (0x1999999999999998 < multiplier)) goto LAB_001903cb;
      } while( true );
    }
  }
  oVar4 = handleOverflow(this,rounding_mode);
  return oVar4;
LAB_001903cb:
  APInt::tcMultiplyPart(dst,dst,multiplier,carry,uVar15,uVar15 + 1,false);
  uVar3 = uVar15 + 1;
  if (dst[uVar15] == 0) {
    uVar3 = uVar15;
  }
  uVar15 = uVar3;
  if (pbVar13 < begin) {
    local_38->field_0x12 = local_38->field_0x12 & 0xf8 | 2;
    oVar4 = roundSignificandWithExponent(local_38,dst,uVar15,exp,rounding_mode);
    operator_delete__(dst);
    return oVar4;
  }
  goto LAB_0019037c;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromDecimalString(StringRef str, roundingMode rounding_mode) {
  decimalInfo D;
  opStatus fs;

  /* Scan the text.  */
  StringRef::iterator p = str.begin();
  interpretDecimal(p, str.end(), &D);

  /* Handle the quick cases.  First the case of no significant digits,
     i.e. zero, and then exponents that are obviously too large or too
     small.  Writing L for log 10 / log 2, a number d.ddddd*10^exp
     definitely overflows if

           (exp - 1) * L >= maxExponent

     and definitely underflows to zero where

           (exp + 1) * L <= minExponent - precision

     With integer arithmetic the tightest bounds for L are

           93/28 < L < 196/59            [ numerator <= 256 ]
           42039/12655 < L < 28738/8651  [ numerator <= 65536 ]
  */

  // Test if we have a zero number allowing for strings with no null terminators
  // and zero decimals with non-zero exponents.
  //
  // We computed firstSigDigit by ignoring all zeros and dots. Thus if
  // D->firstSigDigit equals str.end(), every digit must be a zero and there can
  // be at most one dot. On the other hand, if we have a zero with a non-zero
  // exponent, then we know that D.firstSigDigit will be non-numeric.
  if (D.firstSigDigit == str.end() || decDigitValue(*D.firstSigDigit) >= 10U) {
    category = fcZero;
    fs = opOK;

  /* Check whether the normalized exponent is high enough to overflow
     max during the log-rebasing in the max-exponent check below. */
  } else if (D.normalizedExponent - 1 > INT_MAX / 42039) {
    fs = handleOverflow(rounding_mode);

  /* If it wasn't, then it also wasn't high enough to overflow max
     during the log-rebasing in the min-exponent check.  Check that it
     won't overflow min in either check, then perform the min-exponent
     check. */
  } else if (D.normalizedExponent - 1 < INT_MIN / 42039 ||
             (D.normalizedExponent + 1) * 28738 <=
               8651 * (semantics->minExponent - (int) semantics->precision)) {
    /* Underflow to zero and round.  */
    category = fcNormal;
    zeroSignificand();
    fs = normalize(rounding_mode, lfLessThanHalf);

  /* We can finally safely perform the max-exponent check. */
  } else if ((D.normalizedExponent - 1) * 42039
             >= 12655 * semantics->maxExponent) {
    /* Overflow and round.  */
    fs = handleOverflow(rounding_mode);
  } else {
    integerPart *decSignificand;
    unsigned int partCount;

    /* A tight upper bound on number of bits required to hold an
       N-digit decimal integer is N * 196 / 59.  Allocate enough space
       to hold the full significand, and an extra part required by
       tcMultiplyPart.  */
    partCount = static_cast<unsigned int>(D.lastSigDigit - D.firstSigDigit) + 1;
    partCount = partCountForBits(1 + 196 * partCount / 59);
    decSignificand = new integerPart[partCount + 1];
    partCount = 0;

    /* Convert to binary efficiently - we do almost all multiplication
       in an integerPart.  When this would overflow do we do a single
       bignum multiplication, and then revert again to multiplication
       in an integerPart.  */
    do {
      integerPart decValue, val, multiplier;

      val = 0;
      multiplier = 1;

      do {
        if (*p == '.') {
          p++;
          if (p == str.end()) {
            break;
          }
        }
        decValue = decDigitValue(*p++);
        assert(decValue < 10U && "Invalid character in significand");
        multiplier *= 10;
        val = val * 10 + decValue;
        /* The maximum number that can be multiplied by ten with any
           digit added without overflowing an integerPart.  */
      } while (p <= D.lastSigDigit && multiplier <= (~ (integerPart) 0 - 9) / 10);

      /* Multiply out the current part.  */
      APInt::tcMultiplyPart(decSignificand, decSignificand, multiplier, val,
                            partCount, partCount + 1, false);

      /* If we used another part (likely but not guaranteed), increase
         the count.  */
      if (decSignificand[partCount])
        partCount++;
    } while (p <= D.lastSigDigit);

    category = fcNormal;
    fs = roundSignificandWithExponent(decSignificand, partCount,
                                      D.exponent, rounding_mode);

    delete [] decSignificand;
  }

  return fs;
}